

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferV.cpp
# Opt level: O1

void __thiscall
adios2::format::BufferV::BufferV
          (BufferV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize)

{
  pointer pcVar1;
  
  this->_vptr_BufferV = (_func_int **)&PTR__BufferV_00883b98;
  (this->m_Type)._M_dataplus._M_p = (pointer)&(this->m_Type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Type,pcVar1,pcVar1 + type->_M_string_length);
  this->m_MemAlign = MemAlign;
  this->m_MemBlockSize = MemBlockSize;
  (this->zero).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->zero).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->zero).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_AlwaysCopy = AlwaysCopy;
  (this->DataV).
  super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DataV).
  super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DataV).
  super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->CurOffset = 0;
  this->m_internalPos = 0;
  return;
}

Assistant:

BufferV::BufferV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
                 const size_t MemBlockSize)
: m_Type(type), m_MemAlign(MemAlign), m_MemBlockSize(MemBlockSize), m_AlwaysCopy(AlwaysCopy)
{
}